

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ReduceRightHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  Var pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var8;
  undefined4 *puVar9;
  char16_t *varName;
  uint32 nValue;
  uint start;
  uint uVar10;
  uint uVar11;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_38;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a6698e:
    varName = L"[TypedArray].prototype.reduceRight";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.reduceRight";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_00a6698e;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      local_38 = (Var)0x0;
      start = 0;
      bVar3 = false;
      uVar11 = length;
      while ((uVar11 = uVar11 - 1, start < length && (!bVar3))) {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar5 = JavascriptOperators::HasItem(obj,uVar11);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (BVar5 != 0) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_38 = JavascriptOperators::GetItem(obj,uVar11,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          bVar3 = true;
        }
        start = start + 1;
      }
    }
    else {
      bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
      if (!bVar3) {
        bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
        if (bVar3) {
LAB_00a669f3:
          Throw::FatalInternalError(-0x7fffbffb);
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2832,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (bVar3) {
          *puVar9 = 0;
          goto LAB_00a669f3;
        }
        goto LAB_00a66aa1;
      }
      uVar11 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
      if (length <= uVar11) {
        uVar11 = length;
      }
      bVar4 = true;
      local_38 = (Var)0x0;
      start = 0;
      bVar3 = false;
      uVar10 = length;
      while ((uVar10 = uVar10 - 1, start < uVar11 && (bVar4))) {
        iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)uVar10);
        local_38 = (Var)CONCAT44(extraout_var,iVar6);
        start = start + 1;
        bVar3 = true;
        bVar4 = false;
      }
    }
    if (!bVar3) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,(PCWSTR)0x0);
    }
  }
  else {
    local_38 = Arguments::operator[](args,2);
    start = 0;
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_38 = ReduceRightObjectHelper<unsigned_int>
                         (obj,length,start,(RecyclableObject *)jsReentLock._24_8_,local_38,
                          scriptContext);
  }
  else {
    pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
    if (!bVar3) {
      bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2856,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar3) {
LAB_00a66aa1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    uVar11 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
    if (length <= uVar11) {
      uVar11 = length;
    }
    nValue = ~start + length;
    for (; start < uVar11; start = start + 1) {
      iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase);
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      this = scriptContext->threadContext;
      bVar3 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var8);
      p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
      pvVar7 = JavascriptNumber::ToVar(nValue,scriptContext);
      local_38 = (*p_Var8)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                           0x2000005,0,0,0,0,0x2000005,pRVar1,local_38,
                           CONCAT44(extraout_var_00,iVar6),pvVar7,typedArrayBase);
      this->reentrancySafeOrHandled = bVar3;
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      nValue = nValue - 1;
    }
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::ReduceRightHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduceRight"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduceRight"));
            }
        }

        // If we came from Array.prototype.reduceRight and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;
        T k = 0;
        T index = 0;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }

            bool bPresent = false;
            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    index = length - k - 1;
                    element = typedArrayBase->DirectGetItem((uint32)index);
                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    index = length - k - 1;
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, index, scriptContext));
                        bPresent = true;
                    }
                }
            }
            if (bPresent == false)
            {
                JavascriptError::ThrowTypeError(scriptContext, VBSERR_ActionNotSupported);
            }
        }

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                index = length - k - 1;
                element = typedArrayBase->DirectGetItem((uint32)index);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceRightObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }